

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Queries::ErrorsTest::testNegativeNumberOfObjects(ErrorsTest *this)

{
  int iVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *pTVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  Enum<int,_2UL> EVar7;
  MessageBuilder local_360;
  GetNameFunc local_1e0;
  int local_1d8;
  Enum<int,_2UL> local_1d0 [2];
  MessageBuilder local_1b0;
  int local_2c;
  int local_28;
  GLenum error;
  GLuint query;
  GLuint i;
  Functions *gl;
  ErrorsTest *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  _query = CONCAT44(extraout_var,iVar1);
  error = 0;
  while( true ) {
    if (6 < error) {
      return true;
    }
    local_28 = 0;
    (**(code **)(_query + 0x3d8))((&s_targets)[error],0xffffffff,&local_28);
    local_2c = (**(code **)(_query + 0x800))();
    if (local_2c != 0x501) break;
    error = error + 1;
    local_2c = 0x501;
  }
  pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  pTVar5 = tcu::TestContext::getLog(pTVar4);
  tcu::TestLog::operator<<(&local_1b0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_1b0,(char (*) [36])"glCreateQueries called with target ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char **)(s_target_names + (ulong)error * 8));
  pMVar6 = tcu::MessageBuilder::operator<<
                     (pMVar6,(char (*) [73])
                             " with negative number of objects to be created (-1) has generated error "
                     );
  EVar7 = glu::getErrorStr(local_2c);
  local_1e0 = EVar7.m_getName;
  local_1d8 = EVar7.m_value;
  local_1d0[0].m_getName = local_1e0;
  local_1d0[0].m_value = local_1d8;
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_1d0);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (pMVar6,(char (*) [41])", however GL_INVALID_VALUE was expected.");
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  if (local_28 != 0) {
    (**(code **)(_query + 0x458))(1,&local_28);
    do {
      iVar1 = local_2c;
      iVar2 = (**(code **)(_query + 0x800))();
    } while (iVar1 == iVar2);
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_360,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_360,(char (*) [36])"glCreateQueries called with target ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char **)(s_target_names + (ulong)error * 8));
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [85])
                               " with negative number of objects to be created (-1) has created at least one object."
                       );
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_360);
  }
  return false;
}

Assistant:

bool ErrorsTest::testNegativeNumberOfObjects()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Test for each target. */
	for (glw::GLuint i = 0; i < s_targets_count; ++i)
	{
		glw::GLuint query = 0;

		gl.createQueries(s_targets[i], -1, &query); /* Create negative number of queries. */

		glw::GLenum error = gl.getError();

		if (GL_INVALID_VALUE != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "glCreateQueries called with target " << s_target_names[i]
				<< " with negative number of objects to be created (-1) has generated error " << glu::getErrorStr(error)
				<< ", however GL_INVALID_VALUE was expected." << tcu::TestLog::EndMessage;

			if (query)
			{
				gl.deleteQueries(1, &query);

				while (error == gl.getError())
					;

				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "glCreateQueries called with target " << s_target_names[i]
					<< " with negative number of objects to be created (-1) has created at least one object."
					<< tcu::TestLog::EndMessage;
			}

			return false;
		}
	}

	return true;
}